

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.h
# Opt level: O2

void __thiscall Semaphore::p(Semaphore *this)

{
  int iVar1;
  undefined8 *puVar2;
  
  iVar1 = sem_wait((sem_t *)this);
  if (iVar1 == 0) {
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "sem_wait: failed";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

void p() {
#ifdef _WIN32
        WaitForSingleObject( sem, INFINITE );
#else
        if (sem_wait(&sem) != 0)
            throw "sem_wait: failed";
#endif
    }